

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__udp_recv_start(uv_udp_t *handle,uv_alloc_cb alloc_cb,uv_udp_recv_cb recv_cb)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  sockaddr_in *addr;
  sockaddr local_48 [2];
  
  iVar4 = -0x16;
  if (recv_cb != (uv_udp_recv_cb)0x0 && alloc_cb != (uv_alloc_cb)0x0) {
    iVar3 = uv__io_active(&handle->io_watcher,1);
    iVar4 = -0x72;
    if (iVar3 == 0) {
      iVar4 = 0;
      if ((handle->io_watcher).fd == -1) {
        local_48[0].sa_data[6] = '\0';
        local_48[0].sa_data[7] = '\0';
        local_48[0].sa_data[8] = '\0';
        local_48[0].sa_data[9] = '\0';
        local_48[0].sa_data[10] = '\0';
        local_48[0].sa_data[0xb] = '\0';
        local_48[0].sa_data[0xc] = '\0';
        local_48[0].sa_data[0xd] = '\0';
        local_48[0].sa_family = 2;
        local_48[0].sa_data[0] = '\0';
        local_48[0].sa_data[1] = '\0';
        local_48[0].sa_data[2] = '\0';
        local_48[0].sa_data[3] = '\0';
        local_48[0].sa_data[4] = '\0';
        local_48[0].sa_data[5] = '\0';
        iVar4 = uv__udp_bind(handle,local_48,0x10,0);
      }
      if (iVar4 == 0) {
        handle->alloc_cb = alloc_cb;
        handle->recv_cb = recv_cb;
        uv__io_start(handle->loop,&handle->io_watcher,1);
        uVar2 = handle->flags;
        iVar4 = 0;
        if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0))
        {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int uv__udp_recv_start(uv_udp_t* handle,
                       uv_alloc_cb alloc_cb,
                       uv_udp_recv_cb recv_cb) {
  int err;

  if (alloc_cb == NULL || recv_cb == NULL)
    return -EINVAL;

  if (uv__io_active(&handle->io_watcher, POLLIN))
    return -EALREADY;  /* FIXME(bnoordhuis) Should be -EBUSY. */

  err = uv__udp_maybe_deferred_bind(handle, AF_INET, 0);
  if (err)
    return err;

  handle->alloc_cb = alloc_cb;
  handle->recv_cb = recv_cb;

  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  uv__handle_start(handle);

  return 0;
}